

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamToolsIndex::CheckVersion(BamToolsIndex *this)

{
  undefined8 uVar1;
  string *message_00;
  long in_RDI;
  string message_1;
  string message;
  int64_t numBytesRead;
  string *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  string *where;
  BamException *in_stack_fffffffffffffe80;
  BamException *this_00;
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [38];
  undefined1 local_10a;
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [38];
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [39];
  undefined1 local_91 [39];
  undefined1 local_6a;
  undefined1 local_69 [56];
  allocator local_31;
  string local_30 [32];
  long local_10;
  
  local_10 = (**(code **)(**(long **)(in_RDI + 0x60) + 0x28))
                       (*(long **)(in_RDI + 0x60),in_RDI + 0x54,4);
  if (local_10 != 4) {
    local_6a = 1;
    uVar1 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"BamToolsIndex::CheckVersion",&local_31);
    this_00 = (BamException *)local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_69 + 1),"could not read format version",(allocator *)this_00);
    BamException::BamException(this_00,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    local_6a = 0;
    __cxa_throw(uVar1,&BamException::typeinfo,BamException::~BamException);
  }
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    SwapEndian_32((int32_t *)(in_RDI + 0x54));
  }
  if (*(int *)(in_RDI + 0x54) < 1) {
    local_ba = 1;
    message_00 = (string *)__cxa_allocate_exception(0x28);
    where = (string *)local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_91 + 1),"BamToolsIndex::CheckVersion",(allocator *)where);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"invalid format version",&local_b9);
    BamException::BamException(in_stack_fffffffffffffe80,where,message_00);
    local_ba = 0;
    __cxa_throw(message_00,&BamException::typeinfo,BamException::~BamException);
  }
  if (*(int *)(in_RDI + 0x58) < *(int *)(in_RDI + 0x54)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_e0,
               "unsupported format: this index was created by a newer version of BamTools. Update your local version of BamTools to use the index file."
               ,&local_e1);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    local_10a = 1;
    uVar1 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"BamToolsIndex::CheckVersion",&local_109);
    BamException::BamException
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    local_10a = 0;
    __cxa_throw(uVar1,&BamException::typeinfo,BamException::~BamException);
  }
  if (*(int *)(in_RDI + 0x54) < 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_130,
               "unsupported format: this version of the index may not properly handle coordinate intervals. Please run \'bamtools index -bti -in yourData.bam\' to generate an up-to-date, fixed BTI file."
               ,&local_131);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    uVar1 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"BamToolsIndex::CheckVersion",&local_159);
    BamException::BamException
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    __cxa_throw(uVar1,&BamException::typeinfo,BamException::~BamException);
  }
  return;
}

Assistant:

void BamToolsIndex::CheckVersion(void) {

    // read version from file
    const int64_t numBytesRead = m_resources.Device->Read((char*)&m_inputVersion, sizeof(m_inputVersion));
    if ( numBytesRead != sizeof(m_inputVersion) )
        throw BamException("BamToolsIndex::CheckVersion", "could not read format version");
    if ( m_isBigEndian ) SwapEndian_32(m_inputVersion);

    // if version is negative, or zero
    if ( m_inputVersion <= 0 )
        throw BamException("BamToolsIndex::CheckVersion", "invalid format version");

    // if version is newer than can be supported by this version of bamtools
    else if ( m_inputVersion > m_outputVersion ) {
        const string message = "unsupported format: this index was created by a newer version of BamTools. "
                               "Update your local version of BamTools to use the index file.";
        throw BamException("BamToolsIndex::CheckVersion", message);
    }

    // ------------------------------------------------------------------
    // check for deprecated, unsupported versions
    // (the format had to be modified to accomodate a particular bug fix)

    // Version 2.0: introduced support for half-open intervals, instead of the old closed intervals
    //   respondBy: throwing exception - we're not going to try to handle the old BTI files.
    else if ( (Version)m_inputVersion < BamToolsIndex::BTI_2_0 ) {
        const string message = "unsupported format: this version of the index may not properly handle "
                               "coordinate intervals. Please run 'bamtools index -bti -in yourData.bam' "
                               "to generate an up-to-date, fixed BTI file.";
        throw BamException("BamToolsIndex::CheckVersion", message);
    }
}